

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O0

bool __thiscall KV::KeyValues::getValueAsBool(KeyValues *this,bool defaultVal)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  exception *anon_var_0;
  bool defaultVal_local;
  KeyValues *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->value);
  this_local._7_1_ = defaultVal;
  if (bVar1) {
    __str = std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::value(&this->value);
    iVar2 = std::__cxx11::stoi(__str,(size_t *)0x0,10);
    this_local._7_1_ = iVar2 != 0;
  }
  return (bool)this_local._7_1_;
}

Assistant:

bool KeyValues::getValueAsBool( bool defaultVal /*= false*/ ) const
	{
		if ( !value )
			return defaultVal;

		try
		{
			return ( std::stoi( value.value() ) != 0 );
		}
		catch ( const std::exception& )
		{
			return defaultVal;
		}
	}